

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.hpp
# Opt level: O0

bool __thiscall Experiments::start(Experiments *this)

{
  undefined4 uVar1;
  byte bVar2;
  int count;
  ostream *this_00;
  vector<Experiments::Node,_std::allocator<Experiments::Node>_> local_3d8;
  ostream local_3c0 [8];
  ofstream out;
  string local_1c0;
  allocator<char> local_199;
  undefined1 local_198 [8];
  Node node2;
  duration<long,_std::ratio<1L,_1000L>_> local_160;
  rep local_158;
  rep local_150;
  string local_148;
  allocator<char> local_121;
  undefined1 local_120 [8];
  Node node1;
  duration<long,_std::ratio<1L,_1000L>_> local_e8;
  rep local_e0;
  rep local_d8;
  string local_d0;
  allocator<char> local_a9;
  undefined1 local_a8 [8];
  Node node;
  duration<long,_std::ratio<1L,_1000L>_> local_70;
  rep local_68;
  rep dF;
  time_point tOF;
  time_point tON;
  int local_48;
  int value;
  int i;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string res;
  Experiments *this_local;
  
  res.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"",&local_31);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < this->size; local_48 = local_48 + 1) {
    count = KBtoSize(this,this->buf_sizes[local_48]);
    InitBuffer(this,count);
    Burn(this,count);
    tOF.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    Forward(this,count);
    dF = std::chrono::_V2::system_clock::now();
    node.time = (int64_t)std::chrono::operator-
                                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)&dF,&tOF);
    local_70.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)&node.time);
    local_68 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_70);
    local_a8._0_4_ = local_48 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&node,"Forward",&local_a9);
    node.name.field_2._8_8_ = local_68;
    std::allocator<char>::~allocator(&local_a9);
    std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::push_back
              (&this->exps,(value_type *)local_a8);
    uVar1 = local_a8._0_4_;
    std::__cxx11::string::string((string *)&local_d0,(string *)&node);
    addDataToString((string *)local_30,uVar1,&local_d0,node.name.field_2._8_8_,
                    this->buf_sizes[local_48]);
    std::__cxx11::string::~string((string *)&local_d0);
    local_d8 = std::chrono::_V2::system_clock::now();
    tOF.__d.__r = (duration)(duration)local_d8;
    Backward(this,count);
    local_e0 = std::chrono::_V2::system_clock::now();
    dF = local_e0;
    node1.time = (int64_t)std::chrono::operator-
                                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)&dF,&tOF);
    local_e8.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)&node1.time);
    local_68 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_e8);
    local_120._0_4_ = local_48 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&node1,"Backward",&local_121);
    node1.name.field_2._8_8_ = local_68;
    std::allocator<char>::~allocator(&local_121);
    std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::push_back
              (&this->exps,(value_type *)local_120);
    uVar1 = local_120._0_4_;
    std::__cxx11::string::string((string *)&local_148,(string *)&node1);
    addDataToString((string *)local_30,uVar1,&local_148,node1.name.field_2._8_8_,
                    this->buf_sizes[local_48]);
    std::__cxx11::string::~string((string *)&local_148);
    local_150 = std::chrono::_V2::system_clock::now();
    tOF.__d.__r = (duration)(duration)local_150;
    Random(this,count);
    local_158 = std::chrono::_V2::system_clock::now();
    dF = local_158;
    node2.time = (int64_t)std::chrono::operator-
                                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)&dF,&tOF);
    local_160.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)&node2.time);
    local_68 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_160);
    local_198._0_4_ = local_48 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&node2,"Random",&local_199);
    node2.name.field_2._8_8_ = local_68;
    std::allocator<char>::~allocator(&local_199);
    std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::push_back
              (&this->exps,(value_type *)local_198);
    uVar1 = local_198._0_4_;
    std::__cxx11::string::string((string *)&local_1c0,(string *)&node2);
    addDataToString((string *)local_30,uVar1,&local_1c0,node2.name.field_2._8_8_,
                    this->buf_sizes[local_48]);
    std::__cxx11::string::~string((string *)&local_1c0);
    Node::~Node((Node *)local_198);
    Node::~Node((Node *)local_120);
    Node::~Node((Node *)local_a8);
  }
  std::ofstream::ofstream(local_3c0);
  std::ofstream::open(local_3c0,"..\\result\\data.txt",0x10);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) != 0) {
    this_00 = std::operator<<(local_3c0,(string *)local_30);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::vector(&local_3d8,&this->exps)
  ;
  GraphBuild(this,&local_3d8);
  std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::~vector(&local_3d8);
  std::ofstream::~ofstream(local_3c0);
  std::__cxx11::string::~string((string *)local_30);
  return true;
}

Assistant:

bool Experiments::start() {
    string res="";
    for (int i = 0; i < size; i++) {
        int value = KBtoSize(buf_sizes[i]);

        InitBuffer(value);
        Burn(value);

        //прямой
        auto tON = std::chrono::high_resolution_clock::now();
        Forward(value);
        auto tOF = std::chrono::high_resolution_clock::now();
        auto dF = std::chrono::duration_cast<std::chrono::milliseconds>(tOF - tON).count();

        Node node{(unsigned int)i+1, "Forward", dF};
        exps.push_back(node);
        addDataToString(res, node.id, node.name, node.time, buf_sizes[i]);

        //обратный
        tON = std::chrono::high_resolution_clock::now();
        Backward(value);
        tOF = std::chrono::high_resolution_clock::now();
        dF = std::chrono::duration_cast<std::chrono::milliseconds>(tOF - tON).count();

        Node node1{(unsigned int)i+1, "Backward", dF};
        exps.push_back(node1);
        addDataToString(res, node1.id, node1.name, node1.time, buf_sizes[i]);

        //случайный
        tON = std::chrono::high_resolution_clock::now();
        Random(value);
        tOF = std::chrono::high_resolution_clock::now();
        dF = std::chrono::duration_cast<std::chrono::milliseconds>(tOF - tON).count();

        Node node2{(unsigned int)i+1, "Random", dF};
        exps.push_back(node2);
        addDataToString(res, node2.id, node2.name, node2.time, buf_sizes[i]);
    }
    std::ofstream out;          // поток для записи
    out.open("..\\result\\data.txt"); // окрываем файл для записи
    if (out.is_open())
    {
        out << res << endl;
    }
    GraphBuild(exps);
    return true;
}